

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch.c
# Opt level: O2

Integer pnga_sprs_array_count_sketch
                  (Integer s_a,Integer size_k,Integer *g_k,Integer *g_w,Integer trans)

{
  long lVar1;
  long *plVar2;
  int *piVar3;
  double *pdVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  double dVar8;
  double dVar9;
  long lVar10;
  long lVar11;
  DoublePrecision DVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  uint uVar18;
  Integer IVar19;
  Integer IVar20;
  void *pvVar21;
  Integer *mapc;
  void *buf;
  Integer IVar22;
  void *pvVar23;
  void *__ptr;
  void *__ptr_00;
  long lVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  _sparse_array *p_Var34;
  float fVar35;
  float fVar36;
  long local_130;
  void *vptr;
  undefined8 uStack_120;
  Integer local_110;
  Integer lo [2];
  Integer hi [2];
  int64_t *jptr;
  int64_t *iptr;
  Integer local_80;
  Integer nblocks [2];
  Integer local_58;
  long local_50;
  Integer jhi;
  Integer jlo;
  
  lVar1 = s_a + 1000;
  if (SPA[lVar1].idim < size_k) {
    pnga_error("Row dimension of sketch matrix must be less than rowdimension of original matrix",
               size_k);
  }
  if (SPA[lVar1].type == 0x3f8) {
    pnga_error("Data type of sparse matrix cannot be of type long long",0x3f8);
  }
  lVar33 = SPA[lVar1].ihi - SPA[lVar1].ilo;
  IVar22 = SPA[lVar1].idim;
  lVar10 = SPA[lVar1].jdim;
  local_80 = SPA[lVar1].idx_size;
  lVar29 = SPA[lVar1].type;
  IVar19 = pnga_pgroup_nnodes(SPA[lVar1].grp);
  IVar20 = pnga_pgroup_nodeid(SPA[lVar1].grp);
  pvVar21 = malloc(IVar19 * 8);
  mapc = (Integer *)malloc(IVar19 * 8 + 8);
  lVar27 = 0;
  lVar24 = 0;
  if (0 < IVar19) {
    lVar24 = IVar19;
  }
  for (; lVar24 != lVar27; lVar27 = lVar27 + 1) {
    *(undefined8 *)((long)pvVar21 + lVar27 * 8) = 0;
  }
  lVar24 = lVar33 + 1;
  *(long *)((long)pvVar21 + IVar20 * 8) = lVar24;
  pnga_pgroup_gop(SPA[lVar1].grp,(ulong)(local_80 != 4) + 0x3e9,pvVar21,IVar19,"+");
  *mapc = 1;
  lVar27 = 1;
  for (lVar25 = lVar27; lVar25 < IVar19; lVar25 = lVar25 + 1) {
    lVar27 = lVar27 + *(long *)((long)pvVar21 + lVar25 * 8 + -8);
    mapc[lVar25] = lVar27;
  }
  mapc[IVar19] = 1;
  nblocks[1] = 1;
  nblocks[0] = IVar19;
  pvVar21 = malloc(lVar24 * 8);
  for (lVar27 = 0; lVar27 <= lVar33; lVar27 = lVar27 + 1) {
    DVar12 = pnga_rand(0);
    *(long *)((long)pvVar21 + lVar27 * 8) = (long)(DVar12 * (double)size_k);
  }
  buf = malloc(SPA[lVar1].size * lVar24);
  lVar27 = 8;
  uVar28 = lVar29 - 0x3e9;
  for (lVar29 = 0; lVar29 <= lVar33; lVar29 = lVar29 + 1) {
    DVar12 = pnga_rand(0);
    if (uVar28 < 0x10) {
      uVar18 = -(uint)((int)(DVar12 + DVar12) == 0) | 1;
      switch(uVar28) {
      case 0:
        *(uint *)((long)buf + lVar29 * 4) = uVar18;
        break;
      case 1:
      case 0xf:
        *(long *)((long)buf + lVar29 * 8) = (long)(int)uVar18;
        break;
      case 2:
        *(float *)((long)buf + lVar29 * 4) = (float)(int)uVar18;
        break;
      case 3:
        *(double *)((long)buf + lVar29 * 8) = (double)(int)uVar18;
        break;
      case 5:
        *(float *)((long)buf + lVar29 * 8) = (float)(int)uVar18;
        *(undefined4 *)((long)buf + lVar29 * 8 + 4) = 0;
        break;
      case 6:
        *(double *)((long)buf + lVar27 + -8) = (double)(int)uVar18;
        *(undefined8 *)((long)buf + lVar27) = 0;
      }
    }
    lVar27 = lVar27 + 0x10;
  }
  IVar19 = pnga_create_handle();
  *g_w = IVar19;
  local_58 = IVar22;
  pnga_set_data(IVar19,1,&local_58,SPA[lVar1].type);
  pnga_set_irreg_distr(*g_w,mapc,nblocks);
  pnga_set_pgroup(*g_w,SPA[lVar1].grp);
  pnga_allocate(*g_w);
  IVar22 = pnga_create_handle();
  *g_k = IVar22;
  pnga_set_data(IVar22,1,&local_58,0x3e9);
  pnga_set_irreg_distr(*g_k,mapc,nblocks);
  pnga_set_pgroup(*g_k,SPA[lVar1].grp);
  pnga_allocate(*g_k);
  lo[0] = SPA[lVar1].ilo + 1;
  hi[0] = SPA[lVar1].ihi + 1;
  local_130 = lVar24;
  pvVar23 = malloc(lVar24 * 4);
  for (lVar29 = 0; lVar29 <= lVar33; lVar29 = lVar29 + 1) {
    *(undefined4 *)((long)pvVar23 + lVar29 * 4) = *(undefined4 *)((long)pvVar21 + lVar29 * 8);
  }
  pnga_put(*g_k,lo,hi,pvVar23,&local_130);
  free(pvVar23);
  pnga_put(*g_w,lo,hi,buf,&local_130);
  pnga_pgroup_sync(SPA[lVar1].grp);
  lVar29 = 0;
  local_110 = pnga_create_handle();
  local_50 = size_k;
  local_58 = lVar10;
  if (trans == 0) {
    local_50 = lVar10;
    local_58 = size_k;
  }
  pnga_set_data(local_110,2,&local_58,SPA[lVar1].type);
  pnga_set_pgroup(local_110,SPA[lVar1].grp);
  pnga_allocate(local_110);
  pnga_zero(local_110);
  pvVar23 = malloc(size_k * 8);
  __ptr = malloc(lVar24 * 8);
  if (size_k < 1) {
    size_k = lVar29;
  }
  for (; size_k != lVar29; lVar29 = lVar29 + 1) {
    *(undefined8 *)((long)pvVar23 + lVar29 * 8) = 0xffffffffffffffff;
  }
  for (lVar29 = 0; lVar29 <= lVar33; lVar29 = lVar29 + 1) {
    lVar24 = *(long *)((long)pvVar21 + lVar29 * 8);
    *(undefined8 *)((long)__ptr + lVar29 * 8) = *(undefined8 *)((long)pvVar23 + lVar24 * 8);
    *(long *)((long)pvVar23 + lVar24 * 8) = lVar29;
  }
  __ptr_00 = malloc(SPA[lVar1].size * lVar10);
  if (trans == 0) {
    lo[1] = 1;
    local_130 = 1;
    hi[1] = lVar10;
  }
  else {
    lo[0] = 1;
    local_130 = lVar10;
    hi[0] = lVar10;
  }
  lVar29 = 0;
switchD_0014edf4_caseD_4:
  while( true ) {
    p_Var34 = SPA;
    if (lVar29 == size_k) {
      pnga_pgroup_sync(SPA[lVar1].grp);
      free(__ptr_00);
      free(pvVar21);
      free(buf);
      free(pvVar23);
      free(__ptr);
      return local_110;
    }
    lVar24 = *(long *)((long)pvVar23 + lVar29 * 8);
    if (-1 < lVar24) break;
    lVar29 = lVar29 + 1;
  }
  memset(__ptr_00,0,SPA[lVar1].size * lVar10);
  lVar29 = lVar29 + 1;
  for (; -1 < lVar24; lVar24 = *(long *)((long)__ptr + lVar24 * 8)) {
    IVar22 = lVar29;
    IVar19 = lVar29;
    if (trans != 0) {
      IVar22 = lo[0];
      lo[1] = lVar29;
      IVar19 = hi[0];
      hi[1] = lVar29;
    }
    hi[0] = IVar19;
    lo[0] = IVar22;
    lVar27 = lVar24 * 2 + 1;
    for (lVar33 = 0; lVar33 < p_Var34[lVar1].nblocks; lVar33 = lVar33 + 1) {
      pnga_sprs_array_column_distribution(s_a,p_Var34[lVar1].blkidx[lVar33],&jlo,&jhi);
      if (local_80 == 4) {
        pnga_sprs_array_access_col_block(s_a,lVar33,&iptr,&jptr,&vptr);
        uVar18 = *(int *)((long)iptr + lVar24 * 4 + 4) - *(int *)((long)iptr + lVar24 * 4);
        uVar26 = (ulong)uVar18;
        if ((int)uVar18 < 1) {
          uVar26 = 0;
        }
        for (uVar30 = 0; uVar26 != uVar30; uVar30 = uVar30 + 1) {
          if (uVar28 < 0x10) {
            lVar31 = (long)*(int *)((long)iptr + lVar24 * 4) + uVar30;
            lVar25 = (long)*(int *)((long)jptr + lVar31 * 4);
            switch(uVar28) {
            case 0:
              piVar3 = (int *)((long)__ptr_00 + lVar25 * 4);
              *piVar3 = *piVar3 + *(int *)((long)vptr + lVar31 * 4) *
                                  *(int *)((long)buf + lVar24 * 4);
              break;
            case 1:
            case 0xf:
              plVar2 = (long *)((long)__ptr_00 + lVar25 * 8);
              *plVar2 = *plVar2 + *(long *)((long)vptr + lVar31 * 8) *
                                  *(long *)((long)buf + lVar24 * 8);
              break;
            case 2:
              *(float *)((long)__ptr_00 + lVar25 * 4) =
                   *(float *)((long)buf + lVar24 * 4) * *(float *)((long)vptr + lVar31 * 4) +
                   *(float *)((long)__ptr_00 + lVar25 * 4);
              break;
            case 3:
              *(double *)((long)__ptr_00 + lVar25 * 8) =
                   *(double *)((long)buf + lVar24 * 8) * *(double *)((long)vptr + lVar31 * 8) +
                   *(double *)((long)__ptr_00 + lVar25 * 8);
              break;
            case 5:
              fVar5 = *(float *)((long)buf + lVar27 * 4);
              uVar7 = *(undefined8 *)((long)vptr + lVar31 * 8);
              fVar6 = *(float *)((long)buf + lVar24 * 8);
              fVar35 = (float)uVar7;
              fVar36 = (float)((ulong)uVar7 >> 0x20);
              uVar7 = *(undefined8 *)((long)__ptr_00 + lVar25 * 8);
              *(ulong *)((long)__ptr_00 + lVar25 * 8) =
                   CONCAT44((float)((ulong)uVar7 >> 0x20) + fVar6 * fVar36 + fVar35 * fVar5,
                            (float)uVar7 + fVar6 * fVar35 + fVar36 * -fVar5);
              break;
            case 6:
              dVar8 = *(double *)((long)buf + lVar27 * 8);
              pdVar4 = (double *)((long)vptr + lVar31 * 0x10);
              dVar16 = *pdVar4;
              dVar17 = pdVar4[1];
              dVar9 = *(double *)((long)buf + lVar24 * 0x10);
              pdVar4 = (double *)((long)__ptr_00 + lVar25 * 0x10);
              dVar15 = pdVar4[1] + dVar9 * dVar17 + dVar16 * dVar8;
              auVar13._8_4_ = SUB84(dVar15,0);
              auVar13._0_8_ = *pdVar4 + dVar9 * dVar16 + dVar17 * -dVar8;
              auVar13._12_4_ = (int)((ulong)dVar15 >> 0x20);
              *(undefined1 (*) [16])((long)__ptr_00 + lVar25 * 0x10) = auVar13;
            }
          }
        }
      }
      else {
        pnga_sprs_array_access_col_block(s_a,lVar33,&iptr,&jptr,&vptr);
        lVar25 = iptr[lVar24 + 1] - iptr[lVar24];
        if (lVar25 < 1) {
          lVar25 = 0;
        }
        for (lVar31 = 0; lVar25 != lVar31; lVar31 = lVar31 + 1) {
          if (uVar28 < 0x10) {
            lVar32 = iptr[lVar24] + lVar31;
            lVar11 = jptr[lVar32];
            switch(uVar28) {
            case 0:
              piVar3 = (int *)((long)__ptr_00 + lVar11 * 4);
              *piVar3 = *piVar3 + *(int *)((long)vptr + lVar32 * 4) *
                                  *(int *)((long)buf + lVar24 * 4);
              break;
            case 1:
            case 0xf:
              plVar2 = (long *)((long)__ptr_00 + lVar11 * 8);
              *plVar2 = *plVar2 + *(long *)((long)vptr + lVar32 * 8) *
                                  *(long *)((long)buf + lVar24 * 8);
              break;
            case 2:
              *(float *)((long)__ptr_00 + lVar11 * 4) =
                   *(float *)((long)buf + lVar24 * 4) * *(float *)((long)vptr + lVar32 * 4) +
                   *(float *)((long)__ptr_00 + lVar11 * 4);
              break;
            case 3:
              *(double *)((long)__ptr_00 + lVar11 * 8) =
                   *(double *)((long)buf + lVar24 * 8) * *(double *)((long)vptr + lVar32 * 8) +
                   *(double *)((long)__ptr_00 + lVar11 * 8);
              break;
            case 5:
              fVar5 = *(float *)((long)buf + lVar27 * 4);
              uVar7 = *(undefined8 *)((long)vptr + lVar32 * 8);
              fVar6 = *(float *)((long)buf + lVar24 * 8);
              fVar35 = (float)uVar7;
              fVar36 = (float)((ulong)uVar7 >> 0x20);
              uVar7 = *(undefined8 *)((long)__ptr_00 + lVar11 * 8);
              *(ulong *)((long)__ptr_00 + lVar11 * 8) =
                   CONCAT44((float)((ulong)uVar7 >> 0x20) + fVar6 * fVar36 + fVar35 * fVar5,
                            (float)uVar7 + fVar6 * fVar35 + fVar36 * -fVar5);
              break;
            case 6:
              dVar8 = *(double *)((long)buf + lVar27 * 8);
              pdVar4 = (double *)((long)vptr + lVar32 * 0x10);
              dVar16 = *pdVar4;
              dVar17 = pdVar4[1];
              dVar9 = *(double *)((long)buf + lVar24 * 0x10);
              pdVar4 = (double *)((long)__ptr_00 + lVar11 * 0x10);
              dVar15 = pdVar4[1] + dVar9 * dVar17 + dVar16 * dVar8;
              auVar14._8_4_ = SUB84(dVar15,0);
              auVar14._0_8_ = *pdVar4 + dVar9 * dVar16 + dVar17 * -dVar8;
              auVar14._12_4_ = (int)((ulong)dVar15 >> 0x20);
              *(undefined1 (*) [16])((long)__ptr_00 + lVar11 * 0x10) = auVar14;
            }
          }
        }
      }
      p_Var34 = SPA;
    }
  }
  switch(uVar28) {
  case 0:
    vptr = (void *)CONCAT44(vptr._4_4_,1);
    break;
  case 1:
  case 0xf:
    vptr = (void *)0x1;
    break;
  case 2:
    vptr = (void *)CONCAT44(vptr._4_4_,0x3f800000);
    break;
  case 3:
    vptr = (void *)0x3ff0000000000000;
    break;
  default:
    goto switchD_0014edf4_caseD_4;
  case 5:
    vptr = (void *)0x3f800000;
    break;
  case 6:
    vptr = (void *)0x3ff0000000000000;
    uStack_120 = 0;
  }
  pnga_acc(local_110,lo,hi,__ptr_00,&local_130,&vptr);
  goto switchD_0014edf4_caseD_4;
}

Assistant:

Integer pnga_sprs_array_count_sketch(Integer s_a, Integer size_k,
    Integer *g_k, Integer *g_w, Integer trans)
{
  Integer i, ii, j, jj, n, hdl, g_a;
  Integer nrows;
  hdl = s_a + GA_OFFSET;
  Integer *klabels;
  void *kweights;
  Integer idim, jdim;
  Integer dims[2];
  Integer one = 1;
  Integer two = 2;
  Integer nblocks[2];
  Integer *top;
  Integer *list;
  void *kbuf;
  Integer nprocs, me;
  Integer k, kk, kcnt;
  Integer idx_size;
  Integer type;
  Integer lo[2], hi[2], ld;
  Integer *map, *size;
  if (SPA[hdl].idim < size_k) {
    pnga_error("Row dimension of sketch matrix must be less than row"
        "dimension of original matrix",size_k);
  }
  /* accumulate operation does not support type C_LONGLONG so fail if this
   *    * data type encountered */
  if (SPA[hdl].type == C_LONGLONG) {
    pnga_error("Data type of sparse matrix"
        " cannot be of type long long",SPA[hdl].type);
  }
  /* how many rows do I own */
  nrows = SPA[hdl].ihi-SPA[hdl].ilo+1;
  idim = SPA[hdl].idim;
  jdim = SPA[hdl].jdim;
  idx_size = SPA[hdl].idx_size;
  type = SPA[hdl].type;
  nprocs = pnga_pgroup_nnodes(SPA[hdl].grp);
  me = pnga_pgroup_nodeid(SPA[hdl].grp);
  /* create map array */
  size = (Integer*)malloc(nprocs*sizeof(Integer));
  map = (Integer*)malloc((nprocs+1)*sizeof(Integer));
  for (i=0; i<nprocs; i++) size[i] = 0;
  size[me] = nrows;
  if (idx_size == 4) {
    pnga_pgroup_gop(SPA[hdl].grp,C_INT,size,nprocs,"+");
  } else {
    pnga_pgroup_gop(SPA[hdl].grp,C_LONG,size,nprocs,"+");
  }
  map[0] = 1;
  for (i=1; i<nprocs; i++) {
    map[i] = map[i-1] + size[i-1];
  }
  map[nprocs] = 1;
  nblocks[0] = nprocs;
  nblocks[1] = 1;
  /* Assign each row to a label in the range  [0,size_k-1] */
  klabels = (Integer*)malloc(nrows*sizeof(Integer));
  for (i=0; i<nrows; i++) {
    klabels[i] = (Integer)(((double)size_k)*pnga_rand(0));
  }
  /* Assign each row a weight +/-1 */
  kweights = malloc(nrows*SPA[hdl].size);
  for (i=0; i<nrows; i++) {
    int val = (int)(2.0*pnga_rand(0));
    if (val == 0) {
      val = -1;
    } else {
      val = 1;
    }
    if (type == C_INT) {
      ((int*)kweights)[i] = val;
    } else if (type == C_LONG) {
      ((long*)kweights)[i] = (long)val;
    } else if (type == C_LONGLONG) {
      ((long long*)kweights)[i] = (long long)val;
    } else if (type == C_FLOAT) {
      ((float*)kweights)[i] = (float)val;
    } else if (type == C_DBL) {
      ((double*)kweights)[i] = (double)val;
    } else if (type == C_SCPL) {
      ((float*)kweights)[2*i] = (float)val;
      ((float*)kweights)[2*i+1] = 0.0;
    } else if (type == C_DCPL) {
      ((double*)kweights)[2*i] = (double)val;
      ((double*)kweights)[2*i+1] = 0.0;
    }
  }
  /* create distributed vectors to hold values in kweights and klabels */
  *g_w = pnga_create_handle();
  dims[0] = idim;
  pnga_set_data(*g_w,one,dims,SPA[hdl].type);
  pnga_set_irreg_distr(*g_w,map,nblocks);
  pnga_set_pgroup(*g_w,SPA[hdl].grp);
  pnga_allocate(*g_w);

  *g_k = pnga_create_handle();
  pnga_set_data(*g_k,one,dims,C_INT);
  pnga_set_irreg_distr(*g_k,map,nblocks);
  pnga_set_pgroup(*g_k,SPA[hdl].grp);
  pnga_allocate(*g_k);

  /* fill k-label and weight arrays */
  lo[0] = SPA[hdl].ilo+1; 
  hi[0] = SPA[hdl].ihi+1; 
  ld = nrows;
  kbuf = malloc(nrows*sizeof(int));
  for (i=0; i<nrows; i++) {
    ((int*)kbuf)[i] = (int)klabels[i];
  }
  pnga_put(*g_k,lo,hi,kbuf,&ld);
  free(kbuf);
  pnga_put(*g_w,lo,hi,kweights,&ld);
  pnga_pgroup_sync(SPA[hdl].grp);
  /* Create an output matrix of size_k by jdim */
  g_a = pnga_create_handle();
  if (trans) {
    dims[0] = jdim;
    dims[1] = size_k;
  } else {
    dims[0] = size_k;
    dims[1] = jdim;
  }
  pnga_set_data(g_a,two,dims,SPA[hdl].type);
  pnga_set_pgroup(g_a,SPA[hdl].grp);
  pnga_allocate(g_a);
  pnga_zero(g_a);

  /* create a linked list of rows that map to each k-index */
  top = (Integer*)malloc(size_k*sizeof(Integer));
  list = (Integer*)malloc(nrows*sizeof(Integer));
  for (i=0; i<size_k; i++) top[i] = -1;
  for (i=0; i<nrows; i++) {
    list[i] = top[klabels[i]];
    top[klabels[i]] = i;
  }
  
  /* loop over all values of k */
  kbuf = malloc(jdim*SPA[hdl].size);
  if (trans) {
    lo[0] = 1;
    hi[0] = jdim;
    ld = jdim;
  } else {
    lo[1] = 1;
    hi[1] = jdim;
    ld = 1;
  }
  for (kk = 0; kk<size_k; kk++) {
    /* accumulate all non-zero values that contribute to this value of k */
    if (top[kk] > -1) {
      Integer irow = top[kk];
      memset(kbuf,0,jdim*SPA[hdl].size);
      while (irow > -1) {
        /* loop over column blocks */
        if (trans) {
          lo[1] = kk+1;
          hi[1] = kk+1;
        } else {
          lo[0] = kk+1;
          hi[0] = kk+1;
        }
        for (n=0; n<SPA[hdl].nblocks; n++) {
          Integer nblk = SPA[hdl].blkidx[n];
          void *vptr;
          Integer jlo, jhi;
          pnga_sprs_array_column_distribution(s_a,nblk,&jlo,&jhi);
          if (idx_size == 4) {
            int *iptr;
            int *jptr;
            pnga_sprs_array_access_col_block(s_a,n,&iptr,&jptr,&vptr);
            Integer idx = irow;
            Integer kcols = iptr[idx+1]-iptr[idx];
            for (k = 0; k<kcols; k++) {
              Integer jdx = jptr[iptr[idx]+k];
              if (type == C_INT) {
                ((int*)kbuf)[jdx] += ((int*)kweights)[idx]*
                  ((int*)vptr)[iptr[idx]+k];
              } else if (type == C_LONG) {
                ((long*)kbuf)[jdx] += ((long*)kweights)[idx]*
                  ((long*)vptr)[iptr[idx]+k];
              } else if (type == C_LONGLONG) {
                ((long long*)kbuf)[jdx] += ((long long*)kweights)[idx]*
                  ((long long*)vptr)[iptr[idx]+k];
              } else if (type == C_FLOAT) {
                ((float*)kbuf)[jdx] += ((float*)kweights)[idx]*
                  ((float*)vptr)[iptr[idx]+k];
              } else if (type == C_DBL) {
                ((double*)kbuf)[jdx] += ((double*)kweights)[idx]*
                  ((double*)vptr)[iptr[idx]+k];
              } else if (type == C_SCPL) {
                float rw, iw, rv, iv;
                rw = ((float*)kweights)[2*idx];
                iw = ((float*)kweights)[2*idx+1];
                rv = ((float*)vptr)[2*(iptr[idx]+k)];
                iv = ((float*)vptr)[2*(iptr[idx]+k)+1];
                ((float*)kbuf)[2*jdx] += rw*rv-iw*iv;
                ((float*)kbuf)[2*jdx+1] += rw*iv+iw*rv;
              } else if (type == C_DCPL) {
                double rw, iw, rv, iv;
                rw = ((double*)kweights)[2*idx];
                iw = ((double*)kweights)[2*idx+1];
                rv = ((double*)vptr)[2*(iptr[idx]+k)];
                iv = ((double*)vptr)[2*(iptr[idx]+k)+1];
                ((double*)kbuf)[2*jdx] += rw*rv-iw*iv;
                ((double*)kbuf)[2*jdx+1] += rw*iv+iw*rv;
              }
            }
          } else {
            int64_t *iptr;
            int64_t *jptr;
            pnga_sprs_array_access_col_block(s_a,n,&iptr,&jptr,&vptr);
            Integer idx = irow;
            Integer kcols = iptr[idx+1]-iptr[idx];
            for (k = 0; k<kcols; k++) {
              Integer jdx = jptr[iptr[idx]+k];
              if (type == C_INT) {
                ((int*)kbuf)[jdx] += ((int*)kweights)[idx]*
                  ((int*)vptr)[iptr[idx]+k];
              } else if (type == C_LONG) {
                ((long*)kbuf)[jdx] += ((long*)kweights)[idx]*
                  ((long*)vptr)[iptr[idx]+k];
              } else if (type == C_LONGLONG) {
                ((long long*)kbuf)[jdx] += ((long long*)kweights)[idx]*
                  ((long long*)vptr)[iptr[idx]+k];
              } else if (type == C_FLOAT) {
                ((float*)kbuf)[jdx] += ((float*)kweights)[idx]*
                  ((float*)vptr)[iptr[idx]+k];
              } else if (type == C_DBL) {
                ((double*)kbuf)[jdx] += ((double*)kweights)[idx]*
                  ((double*)vptr)[iptr[idx]+k];
              } else if (type == C_SCPL) {
                float rw, iw, rv, iv;
                rw = ((float*)kweights)[2*idx];
                iw = ((float*)kweights)[2*idx+1];
                rv = ((float*)vptr)[2*(iptr[idx]+k)];
                iv = ((float*)vptr)[2*(iptr[idx]+k)+1];
                ((float*)kbuf)[2*jdx] += rw*rv-iw*iv;
                ((float*)kbuf)[2*jdx+1] += rw*iv+iw*rv;
              } else if (type == C_DCPL) {
                double rw, iw, rv, iv;
                rw = ((double*)kweights)[2*idx];
                iw = ((double*)kweights)[2*idx+1];
                rv = ((double*)vptr)[2*(iptr[idx]+k)];
                iv = ((double*)vptr)[2*(iptr[idx]+k)+1];
                ((double*)kbuf)[2*jdx] += rw*rv-iw*iv;
                ((double*)kbuf)[2*jdx+1] += rw*iv+iw*rv;
              }
            }
          }
        }
        irow = list[irow];
      }
      /* accumulate row into g_a */
      if (type == C_INT) {
        int ione = 1;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &ione);
      } else if (type == C_LONG) {
        long lone = 1;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &lone);
      } else if (type == C_LONGLONG) {
        long long llone = 1;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &llone);
      } else if (type == C_FLOAT) {
        float fone = 1.0;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &fone);
      } else if (type == C_DBL) {
        double done = 1.0;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &done);
      } else if (type == C_SCPL) {
        float cone[2];
        cone[0] = 1.0;
        cone[1] = 0.0;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &cone);
      } else if (type == C_DCPL) {
        double zone[2];
        zone[0] = 1.0;
        zone[1] = 0.0;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &zone);
      }
    }
  }
  pnga_pgroup_sync(SPA[hdl].grp);

  /* free up arrays */
  free(kbuf);
  free(klabels);
  free(kweights);
  free(top);
  free(list);
  return g_a;
}